

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O1

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  _Any_data *p_Var1;
  function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> *pfVar2;
  bool bVar3;
  BasicBlock *local_130;
  undefined1 local_128 [16];
  code *local_118;
  _Manager_type local_110;
  _Invoker_type p_Stack_108;
  DominatorIterator local_f8;
  DominatorIterator local_d0;
  DominatorIterator local_a8;
  DominatorIterator local_80;
  DominatorIterator local_58;
  
  if (this == other) {
    bVar3 = true;
  }
  else {
    DominatorIterator::DominatorIterator(&local_80);
    local_128._0_8_ = (void *)0x0;
    local_128._8_8_ = 0;
    local_110 = std::
                _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
                ::_M_manager;
    DominatorIterator::DominatorIterator
              (&local_d0,other,
               (function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> *)
               local_128);
    if (local_118 != (_Manager_type)0x0) {
      (*local_118)(local_128,local_128,3);
    }
    DominatorIterator::DominatorIterator(&local_f8);
    p_Var1 = (_Any_data *)(local_128 + 8);
    local_128._0_8_ = local_d0.current_;
    local_128._8_8_ = 0;
    local_118 = (_Manager_type)0x0;
    local_110 = (_Manager_type)0x0;
    p_Stack_108 = (_Invoker_type)0x0;
    local_130 = this;
    if (local_d0.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d0.dom_func_.super__Function_base._M_manager)
                (p_Var1,(_Any_data *)&local_d0.dom_func_,__clone_functor);
      local_110 = local_d0.dom_func_.super__Function_base._M_manager;
      p_Stack_108 = local_d0.dom_func_._M_invoker;
    }
    pfVar2 = &local_58.dom_func_;
    local_58.current_ = local_f8.current_;
    local_58.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_58.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_58.dom_func_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_58.dom_func_._M_invoker = (_Invoker_type)0x0;
    if (local_f8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_f8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)&local_f8.dom_func_,__clone_functor);
      local_58.dom_func_.super__Function_base._M_manager =
           local_f8.dom_func_.super__Function_base._M_manager;
      local_58.dom_func_._M_invoker = local_f8.dom_func_._M_invoker;
    }
    std::
    __find_if<spvtools::val::BasicBlock::DominatorIterator,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock_const*const>>
              (&local_a8,(DominatorIterator *)local_128,&local_58,
               (_Iter_equals_val<const_spvtools::val::BasicBlock_*const>)&local_130);
    if (local_58.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (local_110 != (_Manager_type)0x0) {
      (*local_110)(p_Var1,p_Var1,__destroy_functor);
    }
    bVar3 = local_80.current_ != local_a8.current_;
  }
  if (this != other) {
    if (local_a8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_a8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_a8.dom_func_,(_Any_data *)&local_a8.dom_func_,__destroy_functor
                );
    }
    if (local_f8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_f8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_f8.dom_func_,(_Any_data *)&local_f8.dom_func_,__destroy_functor
                );
    }
  }
  if (this != other) {
    if (local_d0.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d0.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_d0.dom_func_,(_Any_data *)&local_d0.dom_func_,__destroy_functor
                );
    }
    if (local_80.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_80.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_80.dom_func_,(_Any_data *)&local_80.dom_func_,__destroy_functor
                );
    }
  }
  return bVar3;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}